

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ast.cpp
# Opt level: O0

string * __thiscall
punky::ast::CallExpression::to_string_abi_cxx11_
          (string *__return_storage_ptr__,CallExpression *this)

{
  bool bVar1;
  pointer pEVar2;
  unique_ptr<std::vector<std::unique_ptr<punky::ast::ExprNode,_std::default_delete<punky::ast::ExprNode>_>,_std::allocator<std::unique_ptr<punky::ast::ExprNode,_std::default_delete<punky::ast::ExprNode>_>_>_>,_std::default_delete<std::vector<std::unique_ptr<punky::ast::ExprNode,_std::default_delete<punky::ast::ExprNode>_>,_std::allocator<std::unique_ptr<punky::ast::ExprNode,_std::default_delete<punky::ast::ExprNode>_>_>_>_>_>
  *this_00;
  type this_01;
  ulong uVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_130;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_110;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f0;
  reference local_d0;
  unique_ptr<punky::ast::ExprNode,_std::default_delete<punky::ast::ExprNode>_> *args;
  iterator __end4;
  iterator __begin4;
  vector<std::unique_ptr<punky::ast::ExprNode,_std::default_delete<punky::ast::ExprNode>_>,_std::allocator<std::unique_ptr<punky::ast::ExprNode,_std::default_delete<punky::ast::ExprNode>_>_>_>
  *__range4;
  string args_str;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  undefined1 local_19;
  CallExpression *local_18;
  CallExpression *this_local;
  string *call_str;
  
  local_19 = 0;
  local_18 = this;
  this_local = (CallExpression *)__return_storage_ptr__;
  std::__cxx11::string::string((string *)__return_storage_ptr__);
  bVar1 = std::unique_ptr::operator_cast_to_bool((unique_ptr *)&this->m_function);
  if (bVar1) {
    pEVar2 = std::unique_ptr<punky::ast::ExprNode,_std::default_delete<punky::ast::ExprNode>_>::
             operator->(&this->m_function);
    (*(pEVar2->super_AstNode)._vptr_AstNode[3])(&local_60);
    ExprNode::token_literal_abi_cxx11_
              ((string *)((long)&args_str.field_2 + 8),&this->super_ExprNode);
    std::operator+(&local_40,&local_60,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   ((long)&args_str.field_2 + 8));
    std::__cxx11::string::append((string *)__return_storage_ptr__);
    std::__cxx11::string::~string((string *)&local_40);
    std::__cxx11::string::~string((string *)(args_str.field_2._M_local_buf + 8));
    std::__cxx11::string::~string((string *)&local_60);
    bVar1 = std::
            optional<std::unique_ptr<std::vector<std::unique_ptr<punky::ast::ExprNode,_std::default_delete<punky::ast::ExprNode>_>,_std::allocator<std::unique_ptr<punky::ast::ExprNode,_std::default_delete<punky::ast::ExprNode>_>_>_>,_std::default_delete<std::vector<std::unique_ptr<punky::ast::ExprNode,_std::default_delete<punky::ast::ExprNode>_>,_std::allocator<std::unique_ptr<punky::ast::ExprNode,_std::default_delete<punky::ast::ExprNode>_>_>_>_>_>_>
            ::has_value(&this->m_arguments);
    if (bVar1) {
      std::__cxx11::string::string((string *)&__range4);
      this_00 = std::
                optional<std::unique_ptr<std::vector<std::unique_ptr<punky::ast::ExprNode,_std::default_delete<punky::ast::ExprNode>_>,_std::allocator<std::unique_ptr<punky::ast::ExprNode,_std::default_delete<punky::ast::ExprNode>_>_>_>,_std::default_delete<std::vector<std::unique_ptr<punky::ast::ExprNode,_std::default_delete<punky::ast::ExprNode>_>,_std::allocator<std::unique_ptr<punky::ast::ExprNode,_std::default_delete<punky::ast::ExprNode>_>_>_>_>_>_>
                ::value(&this->m_arguments);
      this_01 = std::
                unique_ptr<std::vector<std::unique_ptr<punky::ast::ExprNode,_std::default_delete<punky::ast::ExprNode>_>,_std::allocator<std::unique_ptr<punky::ast::ExprNode,_std::default_delete<punky::ast::ExprNode>_>_>_>,_std::default_delete<std::vector<std::unique_ptr<punky::ast::ExprNode,_std::default_delete<punky::ast::ExprNode>_>,_std::allocator<std::unique_ptr<punky::ast::ExprNode,_std::default_delete<punky::ast::ExprNode>_>_>_>_>_>
                ::operator*(this_00);
      __end4 = std::
               vector<std::unique_ptr<punky::ast::ExprNode,_std::default_delete<punky::ast::ExprNode>_>,_std::allocator<std::unique_ptr<punky::ast::ExprNode,_std::default_delete<punky::ast::ExprNode>_>_>_>
               ::begin(this_01);
      args = (unique_ptr<punky::ast::ExprNode,_std::default_delete<punky::ast::ExprNode>_> *)
             std::
             vector<std::unique_ptr<punky::ast::ExprNode,_std::default_delete<punky::ast::ExprNode>_>,_std::allocator<std::unique_ptr<punky::ast::ExprNode,_std::default_delete<punky::ast::ExprNode>_>_>_>
             ::end(this_01);
      while (bVar1 = __gnu_cxx::operator!=
                               (&__end4,(__normal_iterator<std::unique_ptr<punky::ast::ExprNode,_std::default_delete<punky::ast::ExprNode>_>_*,_std::vector<std::unique_ptr<punky::ast::ExprNode,_std::default_delete<punky::ast::ExprNode>_>,_std::allocator<std::unique_ptr<punky::ast::ExprNode,_std::default_delete<punky::ast::ExprNode>_>_>_>_>
                                         *)&args), bVar1) {
        local_d0 = __gnu_cxx::
                   __normal_iterator<std::unique_ptr<punky::ast::ExprNode,_std::default_delete<punky::ast::ExprNode>_>_*,_std::vector<std::unique_ptr<punky::ast::ExprNode,_std::default_delete<punky::ast::ExprNode>_>,_std::allocator<std::unique_ptr<punky::ast::ExprNode,_std::default_delete<punky::ast::ExprNode>_>_>_>_>
                   ::operator*(&__end4);
        pEVar2 = std::unique_ptr<punky::ast::ExprNode,_std::default_delete<punky::ast::ExprNode>_>::
                 operator->(local_d0);
        (*(pEVar2->super_AstNode)._vptr_AstNode[3])(&local_110);
        std::operator+(&local_f0,&local_110,", ");
        std::__cxx11::string::append((string *)&__range4);
        std::__cxx11::string::~string((string *)&local_f0);
        std::__cxx11::string::~string((string *)&local_110);
        __gnu_cxx::
        __normal_iterator<std::unique_ptr<punky::ast::ExprNode,_std::default_delete<punky::ast::ExprNode>_>_*,_std::vector<std::unique_ptr<punky::ast::ExprNode,_std::default_delete<punky::ast::ExprNode>_>,_std::allocator<std::unique_ptr<punky::ast::ExprNode,_std::default_delete<punky::ast::ExprNode>_>_>_>_>
        ::operator++(&__end4);
      }
      uVar3 = std::__cxx11::string::size();
      if (2 < uVar3) {
        std::__cxx11::string::pop_back();
        std::__cxx11::string::pop_back();
      }
      std::operator+(&local_130,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&__range4,
                     ")");
      std::__cxx11::string::append((string *)__return_storage_ptr__);
      std::__cxx11::string::~string((string *)&local_130);
      std::__cxx11::string::~string((string *)&__range4);
    }
    else {
      std::__cxx11::string::append((char *)__return_storage_ptr__);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::string CallExpression::to_string() const
{
    std::string call_str;
    if (m_function)
    {
        call_str.append(m_function->to_string() + token_literal());
        if (m_arguments.has_value())
        {
            std::string args_str;
            for (const auto& args : *m_arguments.value())
                args_str.append(args->to_string() + ", ");
            if (args_str.size() > 2)
            {
                args_str.pop_back();
                args_str.pop_back();
            }
            call_str.append(args_str + ")");
        }
        else
            call_str.append(")");
    }
    return call_str;
}